

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O3

int compression_code_lzma(archive *a,la_zstream *lastrm,la_zaction action)

{
  lzma_stream *strm;
  undefined4 uVar1;
  undefined4 uVar2;
  lzma_ret lVar3;
  uint64_t uVar4;
  
  strm = (lzma_stream *)lastrm->real_stream;
  strm->next_in = lastrm->next_in;
  uVar4 = lastrm->total_in;
  strm->avail_in = lastrm->avail_in;
  strm->total_in = uVar4;
  strm->next_out = lastrm->next_out;
  uVar4 = lastrm->total_out;
  strm->avail_out = lastrm->avail_out;
  strm->total_out = uVar4;
  lVar3 = lzma_code(strm,(uint)(action == ARCHIVE_Z_FINISH) * 3);
  lastrm->next_in = strm->next_in;
  uVar4 = strm->total_in;
  lastrm->avail_in = strm->avail_in;
  lastrm->total_in = uVar4;
  lastrm->next_out = strm->next_out;
  uVar1 = *(undefined4 *)((long)&strm->avail_out + 4);
  uVar4 = strm->total_out;
  uVar2 = *(undefined4 *)((long)&strm->total_out + 4);
  *(int *)&lastrm->avail_out = (int)strm->avail_out;
  *(undefined4 *)((long)&lastrm->avail_out + 4) = uVar1;
  *(int *)&lastrm->total_out = (int)uVar4;
  *(undefined4 *)((long)&lastrm->total_out + 4) = uVar2;
  if (LZMA_STREAM_END < lVar3) {
    if (lVar3 == LZMA_MEMLIMIT_ERROR) {
      uVar4 = lzma_memusage(strm);
      archive_set_error(a,0xc,"lzma compression error: %ju MiB would have been needed",
                        uVar4 + 0xfffff >> 0x14);
    }
    else {
      archive_set_error(a,-1,"lzma compression failed: lzma_code() call returned status %d",
                        (ulong)lVar3);
    }
    lVar3 = 0xffffffe2;
  }
  return lVar3;
}

Assistant:

static int
compression_code_lzma(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	lzma_stream *strm;
	int r;

	strm = (lzma_stream *)lastrm->real_stream;
	strm->next_in = lastrm->next_in;
	strm->avail_in = lastrm->avail_in;
	strm->total_in = lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = lastrm->avail_out;
	strm->total_out = lastrm->total_out;
	r = lzma_code(strm,
	    (action == ARCHIVE_Z_FINISH)? LZMA_FINISH: LZMA_RUN);
	lastrm->next_in = strm->next_in;
	lastrm->avail_in = strm->avail_in;
	lastrm->total_in = strm->total_in;
	lastrm->next_out = strm->next_out;
	lastrm->avail_out = strm->avail_out;
	lastrm->total_out = strm->total_out;
	switch (r) {
	case LZMA_OK:
		/* Non-finishing case */
		return (ARCHIVE_OK);
	case LZMA_STREAM_END:
		/* This return can only occur in finishing case. */
		return (ARCHIVE_EOF);
	case LZMA_MEMLIMIT_ERROR:
		archive_set_error(a, ENOMEM,
		    "lzma compression error:"
		    " %ju MiB would have been needed",
		    (uintmax_t)((lzma_memusage(strm) + 1024 * 1024 -1)
			/ (1024 * 1024)));
		return (ARCHIVE_FATAL);
	default:
		/* Any other return value indicates an error */
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "lzma compression failed:"
		    " lzma_code() call returned status %d", r);
		return (ARCHIVE_FATAL);
	}
}